

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressSequences_bmi2
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  sbyte sVar8;
  undefined8 uVar9;
  seq_t sequence;
  U32 i;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  BYTE *pBVar13;
  BYTE *oend_00;
  BYTE *pBVar14;
  ulong uVar15;
  BYTE *oend;
  BYTE *__dest;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  BYTE *pBVar19;
  size_t sStackY_140;
  BYTE *local_110;
  BYTE *litPtr;
  BIT_DStream_t local_f0;
  ZSTD_fseState local_c8;
  ZSTD_fseState local_b8;
  ZSTD_fseState local_a8;
  size_t local_98 [3];
  BYTE *local_80 [4];
  BYTE *local_60;
  BYTE *local_58;
  ulong local_50;
  size_t sStack_48;
  size_t local_40;
  ZSTD_DCtx *local_38;
  
  if (dctx->litBufferLocation == ZSTD_not_in_dst) {
    oend_00 = (BYTE *)(maxDstSize + (long)dst);
  }
  else {
    oend_00 = dctx->litBuffer;
  }
  litPtr = dctx->litPtr;
  sVar11 = dctx->litSize;
  pBVar13 = litPtr + sVar11;
  local_110 = (BYTE *)dst;
  if (nbSeq == 0) {
LAB_001e4bea:
    uVar15 = (long)pBVar13 - (long)litPtr;
    if ((ulong)((long)oend_00 - (long)local_110) < uVar15) {
      sStackY_140 = 0xffffffffffffffba;
    }
    else {
      if (local_110 == (BYTE *)0x0) {
        local_110 = (BYTE *)0x0;
      }
      else {
        memcpy(local_110,litPtr,uVar15);
        local_110 = local_110 + uVar15;
      }
      sStackY_140 = (long)local_110 - (long)dst;
    }
  }
  else {
    local_60 = (BYTE *)dctx->prefixStart;
    local_80[3] = (BYTE *)dctx->virtualStart;
    local_80[2] = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    for (lVar10 = -0xc; lVar10 != 0; lVar10 = lVar10 + 4) {
      *(ulong *)((long)local_80 + lVar10 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar10);
    }
    local_80[0] = litPtr + sVar11;
    local_80[1] = (BYTE *)dst;
    sVar11 = BIT_initDStream(&local_f0,seqStart,seqSize);
    if (sVar11 < 0xffffffffffffff89) {
      ZSTD_initFseState(&local_c8,&local_f0,dctx->LLTptr);
      ZSTD_initFseState(&local_b8,&local_f0,dctx->OFTptr);
      ZSTD_initFseState(&local_a8,&local_f0,dctx->MLTptr);
      if (local_80[1] == (BYTE *)0x0) {
        __assert_fail("dst != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xaabe,
                      "size_t ZSTD_decompressSequences_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                     );
      }
      local_58 = oend_00 + -0x20;
      local_110 = local_80[1];
      local_38 = dctx;
LAB_001e44f6:
      do {
        pBVar13 = local_60;
        sVar11 = local_98[1];
        bVar2 = local_c8.table[local_c8.state].nbAdditionalBits;
        if (0x10 < bVar2) {
          __assert_fail("llBits <= MaxLLBits",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa948,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
        }
        bVar3 = local_a8.table[local_a8.state].nbAdditionalBits;
        if (0x10 < bVar3) {
          __assert_fail("mlBits <= MaxMLBits",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa949,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
        }
        bVar4 = local_b8.table[local_b8.state].nbAdditionalBits;
        if (0x1f < bVar4) {
          __assert_fail("ofBits <= MaxOff",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa94a,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
        }
        uVar15 = (ulong)local_a8.table[local_a8.state].baseValue;
        uVar18 = local_c8.table[local_c8.state].baseValue;
        local_50 = (ulong)uVar18;
        bVar5 = local_c8.table[local_c8.state].nbBits;
        bVar6 = local_a8.table[local_a8.state].nbBits;
        bVar7 = local_b8.table[local_b8.state].nbBits;
        if (bVar4 < 2) {
          if (bVar4 != 0) {
            uVar12 = (ulong)local_f0.bitsConsumed;
            local_f0.bitsConsumed = local_f0.bitsConsumed + 1;
            lVar10 = (ulong)(local_b8.table[local_b8.state].baseValue + (uint)(uVar18 == 0)) -
                     ((long)(local_f0.bitContainer << (uVar12 & 0x3f)) >> 0x3f);
            if (lVar10 == 3) {
              local_40 = (local_98[0] - 1) + (ulong)(local_98[0] == 1);
LAB_001e4b16:
              local_98[2] = local_98[1];
            }
            else {
              local_40 = local_98[lVar10] + (ulong)(local_98[lVar10] == 0);
              if (lVar10 != 1) goto LAB_001e4b16;
            }
            local_98[1] = local_98[0];
            goto LAB_001e45bc;
          }
          local_40 = local_98[uVar18 == 0];
          local_98[1] = local_98[uVar18 != 0];
          local_98[0] = local_40;
        }
        else {
          uVar12 = (ulong)local_f0.bitsConsumed;
          local_f0.bitsConsumed = local_f0.bitsConsumed + bVar4;
          local_40 = ((local_f0.bitContainer << (uVar12 & 0x3f)) >> ((ulong)(byte)-bVar4 & 0x3f)) +
                     (ulong)local_b8.table[local_b8.state].baseValue;
          local_98[1] = local_98[0];
          local_98[2] = sVar11;
LAB_001e45bc:
          local_98[1] = local_98[0];
          local_98[0] = local_40;
        }
        uVar12 = (ulong)local_f0.bitsConsumed;
        if (bVar3 != 0) {
          uVar16 = uVar12 & 0x3f;
          uVar12 = (ulong)(local_f0.bitsConsumed + bVar3);
          uVar15 = uVar15 + ((local_f0.bitContainer << uVar16) >> ((ulong)(byte)-bVar3 & 0x3f));
        }
        if ((0x1e < (byte)(bVar3 + bVar2 + bVar4)) && (uVar18 = (uint)uVar12, uVar18 < 0x41)) {
          if (local_f0.ptr < local_f0.limitPtr) {
            if (local_f0.ptr == local_f0.start) goto LAB_001e462c;
            uVar16 = (ulong)(uint)((int)local_f0.ptr - (int)local_f0.start);
            if (local_f0.start <= (ulong *)((long)local_f0.ptr - (uVar12 >> 3))) {
              uVar16 = uVar12 >> 3;
            }
            uVar18 = uVar18 + (int)uVar16 * -8;
          }
          else {
            uVar16 = uVar12 >> 3;
            uVar18 = uVar18 & 7;
          }
          local_f0.ptr = (char *)((long)local_f0.ptr - uVar16);
          uVar12 = (ulong)uVar18;
          local_f0.bitContainer = *(size_t *)local_f0.ptr;
        }
LAB_001e462c:
        iVar17 = (int)uVar12;
        if (bVar2 != 0) {
          iVar17 = iVar17 + (uint)bVar2;
          local_50 = local_50 +
                     ((local_f0.bitContainer << (uVar12 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f));
        }
        sVar8 = (bVar5 < 0x41) * ('@' - bVar5);
        local_c8.state =
             (((local_f0.bitContainer >> ((ulong)(byte)-(char)(iVar17 + (uint)bVar5) & 0x3f)) <<
              sVar8) >> sVar8) + (ulong)local_c8.table[local_c8.state].nextState;
        iVar17 = iVar17 + (uint)bVar5 + (uint)bVar6;
        sVar8 = (bVar6 < 0x41) * ('@' - bVar6);
        local_a8.state =
             (((local_f0.bitContainer >> ((ulong)(byte)-(char)iVar17 & 0x3f)) << sVar8) >> sVar8) +
             (ulong)local_a8.table[local_a8.state].nextState;
        local_f0.bitsConsumed = iVar17 + (uint)bVar7;
        sVar8 = (bVar7 < 0x41) * ('@' - bVar7);
        local_b8.state =
             (((local_f0.bitContainer >> ((ulong)(byte)-(char)local_f0.bitsConsumed & 0x3f)) <<
              sVar8) >> sVar8) + (ulong)local_b8.table[local_b8.state].nextState;
        sStack_48 = uVar15;
        pBVar14 = litPtr + local_50;
        local_98[0] = local_40;
        if (local_80[0] < pBVar14) {
LAB_001e48d4:
          sequence.matchLength = uVar15;
          sequence.litLength = local_50;
          sequence.offset = local_40;
          uVar12 = ZSTD_execSequenceEnd
                             (local_110,oend_00,sequence,&litPtr,local_80[0],local_60,local_80[3],
                              local_80[2]);
        }
        else {
          uVar12 = local_50 + uVar15;
          pBVar1 = local_110 + uVar12;
          if (local_58 < pBVar1) goto LAB_001e48d4;
          if ((long)local_50 < 0) {
            __assert_fail("op <= oLitEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa863,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if ((long)uVar12 <= (long)local_50) {
            __assert_fail("oLitEnd < oMatchEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa864,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (oend_00 < pBVar1) {
            __assert_fail("oMatchEnd <= oend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa865,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          __dest = local_110 + local_50;
          if (local_58 < __dest) {
            __assert_fail("oLitEnd <= oend_w",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa867,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          uVar9 = *(undefined8 *)(litPtr + 8);
          *(undefined8 *)local_110 = *(undefined8 *)litPtr;
          *(undefined8 *)(local_110 + 8) = uVar9;
          sVar11 = local_40;
          if (0x10 < local_50) {
            if ((BYTE *)0xffffffffffffffe0 < local_110 + 0x10 + (-0x10 - (long)(litPtr + 0x10)))
            goto LAB_001e4d18;
            uVar9 = *(undefined8 *)(litPtr + 0x18);
            *(undefined8 *)(local_110 + 0x10) = *(undefined8 *)(litPtr + 0x10);
            *(undefined8 *)(local_110 + 0x18) = uVar9;
            if (0x20 < local_50) {
              lVar10 = 0;
              do {
                uVar9 = *(undefined8 *)(litPtr + lVar10 + 0x20 + 8);
                pBVar19 = local_110 + lVar10 + 0x20;
                *(undefined8 *)pBVar19 = *(undefined8 *)(litPtr + lVar10 + 0x20);
                *(undefined8 *)(pBVar19 + 8) = uVar9;
                uVar9 = *(undefined8 *)(litPtr + lVar10 + 0x30 + 8);
                *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(litPtr + lVar10 + 0x30);
                *(undefined8 *)(pBVar19 + 0x18) = uVar9;
                lVar10 = lVar10 + 0x20;
                sVar11 = local_40;
              } while (pBVar19 + 0x20 < __dest);
            }
          }
          pBVar19 = __dest + -local_40;
          litPtr = pBVar14;
          if ((ulong)((long)__dest - (long)local_60) < sVar11) {
            if ((ulong)((long)__dest - (long)local_80[3]) < sVar11) goto LAB_001e4b7b;
            lVar10 = (long)(__dest + -local_40) - (long)local_60;
            pBVar14 = local_80[2] + lVar10;
            if (local_80[2] < pBVar14 + uVar15) {
              memmove(__dest,pBVar14,-lVar10);
              __dest = __dest + -lVar10;
              uVar15 = uVar15 + lVar10;
              sStack_48 = uVar15;
              pBVar19 = pBVar13;
              goto LAB_001e47b6;
            }
            memmove(__dest,pBVar14,uVar15);
          }
          else {
LAB_001e47b6:
            sStack_48 = uVar15;
            if (pBVar1 < __dest) {
              __assert_fail("op <= oMatchEnd",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa888,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (pBVar19 < pBVar13) {
              __assert_fail("match >= prefixStart",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa88a,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (uVar15 == 0) {
              __assert_fail("sequence.matchLength >= 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa88b,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (sVar11 < 0x10) {
              if (__dest < pBVar19) {
                __assert_fail("*ip <= *op",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (sVar11 < 8) {
                iVar17 = *(int *)(ZSTD_overlapCopy8_dec64table + sVar11 * 4);
                *__dest = *pBVar19;
                __dest[1] = pBVar19[1];
                __dest[2] = pBVar19[2];
                __dest[3] = pBVar19[3];
                pBVar13 = pBVar19 + *(uint *)(ZSTD_overlapCopy8_dec32table + sVar11 * 4);
                pBVar19 = pBVar19 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + sVar11 * 4) -
                                    (long)iVar17);
                *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar13;
              }
              else {
                *(undefined8 *)__dest = *(undefined8 *)pBVar19;
              }
              pBVar13 = pBVar19 + 8;
              pBVar14 = __dest + 8;
              if ((long)pBVar14 - (long)pBVar13 < 8) {
                __assert_fail("*op - *ip >= 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (8 < uVar15) {
                if (pBVar1 <= pBVar14) {
                  __assert_fail("op < oMatchEnd",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa89f,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if ((ulong)((long)pBVar14 - (long)pBVar13) < 0x10) {
                  do {
                    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar13;
                    pBVar14 = pBVar14 + 8;
                    pBVar13 = pBVar13 + 8;
                  } while (pBVar14 < __dest + uVar15);
                }
                else {
                  uVar9 = *(undefined8 *)(pBVar19 + 0x10);
                  *(undefined8 *)pBVar14 = *(undefined8 *)pBVar13;
                  *(undefined8 *)(__dest + 0x10) = uVar9;
                  if (0x18 < (long)uVar15) {
                    lVar10 = 0;
                    do {
                      uVar9 = *(undefined8 *)(pBVar19 + lVar10 + 0x18 + 8);
                      pBVar13 = __dest + lVar10 + 0x18;
                      *(undefined8 *)pBVar13 = *(undefined8 *)(pBVar19 + lVar10 + 0x18);
                      *(undefined8 *)(pBVar13 + 8) = uVar9;
                      uVar9 = *(undefined8 *)(pBVar19 + lVar10 + 0x28 + 8);
                      *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(pBVar19 + lVar10 + 0x28);
                      *(undefined8 *)(pBVar13 + 0x18) = uVar9;
                      lVar10 = lVar10 + 0x20;
                    } while (pBVar13 + 0x20 < __dest + uVar15);
                  }
                }
              }
            }
            else {
              if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar19)) {
LAB_001e4d18:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x36a6,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar9 = *(undefined8 *)(pBVar19 + 8);
              *(undefined8 *)__dest = *(undefined8 *)pBVar19;
              *(undefined8 *)(__dest + 8) = uVar9;
              if (0x10 < (long)uVar15) {
                lVar10 = 0x10;
                do {
                  uVar9 = *(undefined8 *)(pBVar19 + lVar10 + 8);
                  pBVar13 = __dest + lVar10;
                  *(undefined8 *)pBVar13 = *(undefined8 *)(pBVar19 + lVar10);
                  *(undefined8 *)(pBVar13 + 8) = uVar9;
                  uVar9 = *(undefined8 *)(pBVar19 + lVar10 + 0x10 + 8);
                  *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(pBVar19 + lVar10 + 0x10);
                  *(undefined8 *)(pBVar13 + 0x18) = uVar9;
                  lVar10 = lVar10 + 0x20;
                } while (pBVar13 + 0x20 < __dest + uVar15);
              }
            }
          }
        }
        if (0xffffffffffffff88 < uVar12) {
          return uVar12;
        }
        local_110 = local_110 + uVar12;
        nbSeq = nbSeq + -1;
        if (nbSeq == 0) {
          if ((local_f0.bitsConsumed < 0x41) &&
             ((local_f0.bitsConsumed != 0x40 || local_f0.ptr != local_f0.start) ||
              local_f0.limitPtr <= local_f0.ptr)) {
            return 0xffffffffffffffec;
          }
          for (lVar10 = 0; dst = local_80[1], pBVar13 = local_80[0], lVar10 != 3;
              lVar10 = lVar10 + 1) {
            (local_38->entropy).rep[lVar10] = (U32)local_98[lVar10];
          }
          goto LAB_001e4bea;
        }
      } while (0x40 < local_f0.bitsConsumed);
      if (local_f0.ptr < local_f0.limitPtr) {
        if (local_f0.ptr == local_f0.start) goto LAB_001e44f6;
        uVar15 = (ulong)(uint)((int)local_f0.ptr - (int)local_f0.start);
        if (local_f0.start <= (ulong *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3))) {
          uVar15 = (ulong)(local_f0.bitsConsumed >> 3);
        }
        local_f0.bitsConsumed = local_f0.bitsConsumed + (int)uVar15 * -8;
      }
      else {
        uVar15 = (ulong)(local_f0.bitsConsumed >> 3);
        local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
      }
      local_f0.ptr = (char *)((long)local_f0.ptr - uVar15);
      local_f0.bitContainer = *(size_t *)local_f0.ptr;
      goto LAB_001e44f6;
    }
LAB_001e4b7b:
    sStackY_140 = 0xffffffffffffffec;
  }
  return sStackY_140;
}

Assistant:

DONT_VECTORIZE
ZSTD_decompressSequences_bmi2(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset,
                           const int frame)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}